

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O2

void __thiscall
TTD::SnapShot::ReLinkThreadContextInfo
          (SnapShot *this,InflateMap *inflator,ThreadContextTTD *intoCtx)

{
  SnapRootInfoEntry *pSVar1;
  TTDSetActiveJsRTContext UNRECOVERED_JUMPTABLE;
  UnorderedArrayListLink *pUVar2;
  UnorderedArrayListLink *pUVar3;
  RecyclableObject *obj;
  ScriptContext *pSVar4;
  void *pvVar5;
  SnapRootInfoEntry *pSVar6;
  UnorderedArrayListLink **ppUVar7;
  SnapRootInfoEntry *rootEntry;
  SnapRootInfoEntry *pSVar8;
  
  pSVar6 = (this->m_rootList).m_inlineHeadBlock.CurrPos;
  pSVar1 = (this->m_rootList).m_inlineHeadBlock.BlockData;
  ppUVar7 = &(this->m_rootList).m_inlineHeadBlock.Next;
  pSVar8 = (SnapRootInfoEntry *)0x0;
  if (pSVar1 != pSVar6) {
    pSVar8 = pSVar1;
  }
  do {
    pUVar2 = *ppUVar7;
    do {
      do {
        pUVar3 = pUVar2;
        if (pSVar8 == (SnapRootInfoEntry *)0x0) {
          if (this->m_activeScriptContext == 0) {
            pSVar4 = (ScriptContext *)0x0;
          }
          else {
            pSVar4 = InflateMap::LookupScriptContext(inflator,this->m_activeScriptContext);
          }
          UNRECOVERED_JUMPTABLE = (intoCtx->TTDExternalObjectFunctions).pfSetActiveJsRTContext;
          pvVar5 = ThreadContextTTD::GetRuntimeHandle(intoCtx);
          (*UNRECOVERED_JUMPTABLE)(pvVar5,pSVar4);
          return;
        }
        obj = InflateMap::LookupObject(inflator,pSVar8->LogObject);
        ThreadContextTTD::ForceSetRootInfoInRestore
                  (intoCtx,pSVar8->LogId,obj,pSVar8->MaybeLongLivedRoot);
        pSVar8 = pSVar8 + 1;
        pUVar2 = pUVar3;
      } while (pSVar8 != pSVar6);
      pSVar8 = (SnapRootInfoEntry *)0x0;
      pUVar2 = (UnorderedArrayListLink *)0x0;
    } while (pUVar3 == (UnorderedArrayListLink *)0x0);
    pSVar6 = pUVar3->CurrPos;
    pSVar8 = pUVar3->BlockData;
    ppUVar7 = &pUVar3->Next;
  } while( true );
}

Assistant:

void SnapShot::ReLinkThreadContextInfo(InflateMap* inflator, ThreadContextTTD* intoCtx) const
    {
        for(auto iter = this->m_rootList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapRootInfoEntry* rootEntry = iter.Current();
            Js::RecyclableObject* rootObj = inflator->LookupObject(rootEntry->LogObject);

            intoCtx->ForceSetRootInfoInRestore(rootEntry->LogId, rootObj, rootEntry->MaybeLongLivedRoot);
        }

        if(this->m_activeScriptContext == TTD_INVALID_LOG_PTR_ID)
        {
            intoCtx->TTDExternalObjectFunctions.pfSetActiveJsRTContext(intoCtx->GetRuntimeHandle(), nullptr);
        }
        else
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(this->m_activeScriptContext);
            intoCtx->TTDExternalObjectFunctions.pfSetActiveJsRTContext(intoCtx->GetRuntimeHandle(), ctx);
        }
    }